

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_options.h
# Opt level: O0

EncoderOptionsBase<draco::GeometryAttribute::Type> * __thiscall
draco::EncoderOptionsBase<draco::GeometryAttribute::Type>::operator=
          (EncoderOptionsBase<draco::GeometryAttribute::Type> *this,
          EncoderOptionsBase<draco::GeometryAttribute::Type> *param_2)

{
  DracoOptions<draco::GeometryAttribute::Type> *in_RSI;
  EncoderOptionsBase<draco::GeometryAttribute::Type> *in_RDI;
  
  DracoOptions<draco::GeometryAttribute::Type>::operator=
            (in_RSI,&in_RDI->super_DracoOptions<draco::GeometryAttribute::Type>);
  Options::operator=(&in_RSI->global_options_,(Options *)in_RDI);
  return in_RDI;
}

Assistant:

static EncoderOptionsBase CreateDefaultOptions() {
    EncoderOptionsBase options;
#ifdef DRACO_STANDARD_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kEdgebreaker, true);
#endif
#ifdef DRACO_PREDICTIVE_EDGEBREAKER_SUPPORTED
    options.SetSupportedFeature(features::kPredictiveEdgebreaker, true);
#endif
    return options;
  }